

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *
vk::enumeratePhysicalDevices
          (vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
           *__return_storage_ptr__,InstanceInterface *vk,VkInstance instance)

{
  VkInstance pVVar1;
  VkInstance pVVar2;
  VkResult VVar3;
  reference ppVVar4;
  ulong uVar5;
  size_type sVar6;
  TestError *this;
  uint local_24;
  VkInstance pVStack_20;
  deUint32 numDevices;
  VkInstance instance_local;
  InstanceInterface *vk_local;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *devices;
  
  local_24 = 0;
  pVStack_20 = instance;
  instance_local = (VkInstance)vk;
  vk_local = (InstanceInterface *)__return_storage_ptr__;
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::vector
            (__return_storage_ptr__);
  VVar3 = (**(code **)(*(long *)instance_local + 8))(instance_local,pVStack_20,&local_24,0);
  checkResult(VVar3,"vk.enumeratePhysicalDevices(instance, &numDevices, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0x25);
  if (local_24 != 0) {
    std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::resize
              (__return_storage_ptr__,(ulong)local_24);
    pVVar2 = instance_local;
    pVVar1 = pVStack_20;
    ppVVar4 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[](__return_storage_ptr__,0);
    VVar3 = (**(code **)(*(long *)pVVar2 + 8))(pVVar2,pVVar1,&local_24,ppVVar4);
    checkResult(VVar3,"vk.enumeratePhysicalDevices(instance, &numDevices, &devices[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0x2a);
    uVar5 = (ulong)local_24;
    sVar6 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                      (__return_storage_ptr__);
    if (uVar5 != sVar6) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Returned device count changed between queries",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x2d);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkPhysicalDevice> enumeratePhysicalDevices (const InstanceInterface& vk, VkInstance instance)
{
	deUint32					numDevices	= 0;
	vector<VkPhysicalDevice>	devices;

	VK_CHECK(vk.enumeratePhysicalDevices(instance, &numDevices, DE_NULL));

	if (numDevices > 0)
	{
		devices.resize(numDevices);
		VK_CHECK(vk.enumeratePhysicalDevices(instance, &numDevices, &devices[0]));

		if ((size_t)numDevices != devices.size())
			TCU_FAIL("Returned device count changed between queries");
	}

	return devices;
}